

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_ptr_array.c
# Opt level: O3

int zt_ptr_array_copy_data(zt_ptr_array *src,char **dstbuf)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  iVar2 = -1;
  if (dstbuf != (char **)0x0 && src != (zt_ptr_array *)0x0) {
    iVar1 = src->count;
    iVar2 = 0;
    if (0 < (long)iVar1) {
      lVar3 = 0;
      do {
        dstbuf[lVar3] = (char *)src->array[lVar3];
        lVar3 = lVar3 + 1;
      } while (iVar1 != lVar3);
    }
  }
  return iVar2;
}

Assistant:

int
zt_ptr_array_copy_data(zt_ptr_array * src, char ** dstbuf) {
    int32_t i;

    if (src == NULL || dstbuf == NULL) {
        return -1;
    }

    for (i = 0; i < src->count; i++) {
        dstbuf[i] = src->array[i];
    }

    return 0;
}